

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O3

MPP_RET h265e_add_sei(MppPacket pkt,RK_S32 *length,RK_U8 *uuid,void *data,RK_S32 size)

{
  MPP_RET len;
  void *pvVar1;
  size_t sVar2;
  RK_U32 recovery_frame_cnt;
  int local_34;
  
  pvVar1 = mpp_packet_get_pos(pkt);
  sVar2 = mpp_packet_get_length(pkt);
  pvVar1 = (void *)((sVar2 & 0xffffffff) + (long)pvVar1);
  if (uuid == uuid_refresh_cfg) {
    local_34 = *data + -1;
    len = h265e_sei_recovery_point(pvVar1,uuid_refresh_cfg,&local_34,0);
  }
  else {
    len = h265e_data_to_sei(pvVar1,uuid,data,size);
  }
  *length = len;
  mpp_packet_set_length(pkt,(ulong)(uint)(len + (int)sVar2));
  mpp_packet_add_segment_info(pkt,0x27,(int)sVar2,len);
  return MPP_OK;
}

Assistant:

static MPP_RET h265e_add_sei(MppPacket pkt, RK_S32 *length, RK_U8 uuid[16],
                             const void *data, RK_S32 size)
{
    RK_U8 *ptr = mpp_packet_get_pos(pkt);
    RK_U32 offset = mpp_packet_get_length(pkt);
    RK_U32 new_length = 0;

    ptr += offset;

    if (uuid == uuid_refresh_cfg) {
        RK_U32 recovery_frame_cnt = ((RK_U32 *)data)[0] - 1;
        new_length = h265e_sei_recovery_point(ptr, uuid, &recovery_frame_cnt, 0);
    } else {
        new_length = h265e_data_to_sei(ptr, uuid, data, size);
    }
    *length = new_length;

    mpp_packet_set_length(pkt, offset + new_length);
    mpp_packet_add_segment_info(pkt, NAL_SEI_PREFIX, offset, new_length);

    return MPP_OK;
}